

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckOfCards.cpp
# Opt level: O2

void __thiscall DeckOfCards::currentState(DeckOfCards *this)

{
  Cards *pCVar1;
  ostream *poVar2;
  Cards *pCVar3;
  Cards i;
  Cards local_90;
  
  pCVar1 = (this->deck->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar3 = (this->deck->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
                super__Vector_impl_data._M_start; pCVar3 != pCVar1; pCVar3 = pCVar3 + 1) {
    Cards::Cards(&local_90,pCVar3);
    poVar2 = operator<<((ostream *)&std::cout,&local_90);
    std::endl<char,std::char_traits<char>>(poVar2);
    Cards::~Cards(&local_90);
  }
  return;
}

Assistant:

void DeckOfCards::currentState() {
    for (Cards i : *deck) {
        cout << i << endl;
    }
}